

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
diligent_spirv_cross::Compiler::get_binary_offset_for_decoration
          (Compiler *this,VariableID id,Decoration decoration,uint32_t *word_offset)

{
  bool bVar1;
  pointer pvVar2;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_58;
  Decoration local_4c;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_48;
  const_iterator itr;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *word_offsets;
  Meta *local_30;
  Meta *m;
  uint32_t *word_offset_local;
  Compiler *pCStack_18;
  Decoration decoration_local;
  Compiler *this_local;
  VariableID id_local;
  
  m = (Meta *)word_offset;
  word_offset_local._4_4_ = decoration;
  pCStack_18 = this;
  this_local._0_4_ = id.id;
  TypedID<(diligent_spirv_cross::Types)0>::TypedID<(diligent_spirv_cross::Types)2>
            ((TypedID<(diligent_spirv_cross::Types)0> *)((long)&word_offsets + 4),
             (TypedID<(diligent_spirv_cross::Types)2> *)&this_local);
  local_30 = ParsedIR::find_meta(&this->ir,word_offsets._4_4_);
  if (local_30 == (Meta *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    itr.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur =
         (_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>)
         &local_30->decoration_word_offset;
    local_4c = word_offset_local._4_4_;
    local_48._M_cur =
         (__node_type *)
         ::std::
         unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         ::find((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 *)itr.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                   ._M_cur,&local_4c);
    local_58._M_cur =
         (__node_type *)
         ::std::
         end<std::unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>>
                   (itr.
                    super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                    _M_cur);
    bVar1 = ::std::__detail::operator==(&local_48,&local_58);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      pvVar2 = ::std::__detail::
               _Node_const_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
               operator->((_Node_const_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                           *)&local_48);
      *(uint *)&(m->decoration).alias = pvVar2->second;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Compiler::get_binary_offset_for_decoration(VariableID id, spv::Decoration decoration, uint32_t &word_offset) const
{
	auto *m = ir.find_meta(id);
	if (!m)
		return false;

	auto &word_offsets = m->decoration_word_offset;
	auto itr = word_offsets.find(decoration);
	if (itr == end(word_offsets))
		return false;

	word_offset = itr->second;
	return true;
}